

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_assignParamsToCCtxParams(ZSTD_CCtx_params cctxParams,ZSTD_parameters params)

{
  ZSTD_CCtx_params *in_RDI;
  ZSTD_CCtx_params *ret;
  
  memcpy(in_RDI,&stack0x00000008,0x80);
  *(void **)&in_RDI->cParams = cctxParams.customMem.opaque;
  (in_RDI->cParams).hashLog = params.cParams.windowLog;
  (in_RDI->cParams).searchLog = params.cParams.chainLog;
  (in_RDI->cParams).minMatch = params.cParams.hashLog;
  (in_RDI->cParams).targetLength = params.cParams.searchLog;
  (in_RDI->cParams).strategy = params.cParams.minMatch;
  (in_RDI->fParams).contentSizeFlag = params.cParams.targetLength;
  (in_RDI->fParams).checksumFlag = params.cParams.strategy;
  (in_RDI->fParams).noDictIDFlag = params.fParams.contentSizeFlag;
  in_RDI->compressionLevel = 3;
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(
        ZSTD_CCtx_params cctxParams, ZSTD_parameters params)
{
    ZSTD_CCtx_params ret = cctxParams;
    ret.cParams = params.cParams;
    ret.fParams = params.fParams;
    ret.compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(params.cParams));
    return ret;
}